

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

void __thiscall spvtools::opt::CopyPropagateArrays::MemoryObject::BuildConstants(MemoryObject *this)

{
  initializer_list<unsigned_int> __l;
  ConstantManager *type;
  bool bVar1;
  uint32_t uVar2;
  reference pAVar3;
  TypeManager *this_00;
  ConstantManager *this_01;
  Constant *c;
  Instruction *this_02;
  allocator<unsigned_int> local_ad;
  anon_union_4_2_642eeacd_for_AccessChainEntry_1 local_ac;
  anon_union_4_2_642eeacd_for_AccessChainEntry_1 *local_a8;
  size_type local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Constant *local_80;
  Constant *index_const;
  ConstantManager *const_mgr;
  Type *uint32_type;
  Integer int_type;
  IRContext *context;
  AccessChainEntry *entry;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  *__range2;
  MemoryObject *this_local;
  
  __end2 = std::
           vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
           ::begin(&this->access_chain_);
  entry = (AccessChainEntry *)
          std::
          vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
          ::end(&this->access_chain_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::CopyPropagateArrays::AccessChainEntry_*,_std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>_>
                                     *)&entry), bVar1) {
    pAVar3 = __gnu_cxx::
             __normal_iterator<spvtools::opt::CopyPropagateArrays::AccessChainEntry_*,_std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>_>
             ::operator*(&__end2);
    if ((pAVar3->is_result_id & 1U) == 0) {
      int_type._40_8_ = Instruction::context(this->variable_inst_);
      analysis::Integer::Integer((Integer *)&uint32_type,0x20,false);
      this_00 = IRContext::get_type_mgr((IRContext *)int_type._40_8_);
      const_mgr = (ConstantManager *)
                  analysis::TypeManager::GetRegisteredType(this_00,(Type *)&uint32_type);
      this_01 = IRContext::get_constant_mgr((IRContext *)int_type._40_8_);
      type = const_mgr;
      local_ac = pAVar3->field_1;
      local_a8 = &local_ac;
      local_a0 = 1;
      index_const = (Constant *)this_01;
      std::allocator<unsigned_int>::allocator(&local_ad);
      __l._M_len = local_a0;
      __l._M_array = (iterator)local_a8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98,__l,&local_ad);
      c = analysis::ConstantManager::GetConstant(this_01,(Type *)type,&local_98);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
      std::allocator<unsigned_int>::~allocator(&local_ad);
      local_80 = c;
      this_02 = analysis::ConstantManager::GetDefiningInstruction
                          ((ConstantManager *)index_const,c,0,(inst_iterator *)0x0);
      uVar2 = Instruction::result_id(this_02);
      (pAVar3->field_1).result_id = uVar2;
      pAVar3->is_result_id = true;
      analysis::Integer::~Integer((Integer *)&uint32_type);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::CopyPropagateArrays::AccessChainEntry_*,_std::vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void CopyPropagateArrays::MemoryObject::BuildConstants() {
  for (auto& entry : access_chain_) {
    if (entry.is_result_id) {
      continue;
    }

    auto context = variable_inst_->context();
    analysis::Integer int_type(32, false);
    const analysis::Type* uint32_type =
        context->get_type_mgr()->GetRegisteredType(&int_type);
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    const analysis::Constant* index_const =
        const_mgr->GetConstant(uint32_type, {entry.immediate});
    entry.result_id =
        const_mgr->GetDefiningInstruction(index_const)->result_id();
    entry.is_result_id = true;
  }
}